

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

response * __thiscall
CppWebSpider::requests::get
          (response *__return_storage_ptr__,requests *this,string *host,string *uri,uint16_t port,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   data,CookieJar *cookie,int timeout)

{
  int sockfd;
  string *psVar1;
  string *this_00;
  __node_base_ptr p_Var2;
  int iVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string sendmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  this_00 = local_50;
  std::__cxx11::string::string(local_50,(string *)host);
  sockfd = init((requests *)this_00,(EVP_PKEY_CTX *)local_50);
  std::__cxx11::string::~string(local_50);
  if (sockfd < 0) {
    std::__cxx11::string::string((string *)&local_90,(string *)host);
    std::__cxx11::string::string((string *)&local_b0,(string *)uri);
    std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&sendmsg);
    response::response(__return_storage_ptr__,&local_90,&local_b0,&local_d0,
                       (CookieJar *)data._M_h._M_bucket_count);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    psVar1 = &local_90;
  }
  else {
    if (data._M_h._M_buckets[3] != (__node_base_ptr)0x0) {
      std::__cxx11::string::append((char *)uri);
    }
    p_Var2 = (__node_base_ptr)(data._M_h._M_buckets + 2);
    iVar3 = 0;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base_ptr)0x0) {
      bVar4 = iVar3 != 0;
      iVar3 = iVar3 + -1;
      if (bVar4) {
        std::__cxx11::string::append((char *)uri);
      }
      std::operator+(&local_1d0,uri,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 1));
      std::operator+(&local_210,&local_1d0,"=");
      std::operator+(&sendmsg,&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 5));
      std::__cxx11::string::operator=((string *)uri,(string *)&sendmsg);
      std::__cxx11::string::~string((string *)&sendmsg);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    std::operator+(&local_70,"GET ",uri);
    std::operator+(&local_f0,&local_70," HTTP/1.1\r\n");
    std::operator+(&local_1d0,&local_f0,"Host: ");
    std::operator+(&local_210,&local_1d0,host);
    std::operator+(&sendmsg,&local_210,"\r\n");
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_110,(string *)&sendmsg);
    std::__cxx11::string::string((string *)&local_130,(string *)host);
    psVar1 = uri;
    std::__cxx11::string::string((string *)&local_150,(string *)uri);
    make_header(&local_210,(requests *)psVar1,&local_110,&local_130,&local_150,headers,
                (CookieJar *)data._M_h._M_bucket_count);
    std::__cxx11::string::operator=((string *)&sendmsg,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&local_170,(string *)host);
    std::__cxx11::string::string((string *)&local_190,(string *)uri);
    psVar1 = &sendmsg;
    std::__cxx11::string::string((string *)&local_1b0,(string *)psVar1);
    request_and_recv(__return_storage_ptr__,(requests *)psVar1,&local_170,&local_190,sockfd,
                     &local_1b0,(CookieJar *)data._M_h._M_bucket_count,
                     (int)data._M_h._M_before_begin._M_nxt);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    close(sockfd);
    psVar1 = &sendmsg;
  }
  std::__cxx11::string::~string((string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

response requests::get(std::string host,std::string uri,uint16_t port,
			   std::unordered_map<std::string,std::string> headers,
			   std::unordered_map<std::string,std::string> data,
			   CookieJar *cookie,
			   int timeout){
		int sockfd;
		if((sockfd=init(host,port))<0)
			return response(host,uri,"",cookie);

		int data_count=0;
		if(data.size()!=0)
			uri+="?";
		for(auto iter=data.begin();iter!=data.end();++iter){
			if(data_count>0)
				uri+="&";
			uri=uri+iter->first+"="+iter->second;
			data_count++;
		}
		//base header
		std::string sendmsg=
				"GET "+uri+" HTTP/1.1\r\n"+
				"Host: "+ host+"\r\n";

		sendmsg=make_header(sendmsg,host,uri,headers,cookie);

		response res=this->request_and_recv(host,uri,sockfd,sendmsg,cookie,timeout);
		close(sockfd);

		return res;
	}